

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void nodeGetCell(Rtree *pRtree,RtreeNode *pNode,int iCell,RtreeCell *pCell)

{
  uint uVar1;
  u8 *puVar2;
  i64 iVar3;
  ulong uVar4;
  long lVar5;
  
  puVar2 = pNode->zData;
  lVar5 = (long)iCell * (ulong)pRtree->nBytesPerCell;
  iVar3 = readInt64(puVar2 + lVar5 + 4);
  pCell->iRowid = iVar3;
  uVar4 = 0;
  do {
    uVar1 = *(uint *)(puVar2 + uVar4 * 4 + lVar5 + 0xc);
    pCell->aCoord[uVar4].u =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar1 = *(uint *)(puVar2 + uVar4 * 4 + lVar5 + 0x10);
    pCell->aCoord[uVar4 + 1].u =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar4 = uVar4 + 2;
  } while (uVar4 < pRtree->nDim2);
  return;
}

Assistant:

static void nodeGetCell(
  Rtree *pRtree,               /* The overall R-Tree */
  RtreeNode *pNode,            /* The node containing the cell to be read */
  int iCell,                   /* Index of the cell within the node */
  RtreeCell *pCell             /* OUT: Write the cell contents here */
){
  u8 *pData;
  RtreeCoord *pCoord;
  int ii = 0;
  pCell->iRowid = nodeGetRowid(pRtree, pNode, iCell);
  pData = pNode->zData + (12 + pRtree->nBytesPerCell*iCell);
  pCoord = pCell->aCoord;
  do{
    readCoord(pData, &pCoord[ii]);
    readCoord(pData+4, &pCoord[ii+1]);
    pData += 8;
    ii += 2;
  }while( ii<pRtree->nDim2 );
}